

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauCanon.c
# Opt level: O0

void Abc_TgPurgeSymmetry(Abc_TgMan_t *pMan,int fHigh)

{
  char cVar1;
  int nVars_00;
  int iVar_00;
  int iVar2;
  int iVar3;
  bool bVar4;
  int jVar;
  int iVar;
  char *pPerm;
  char gcnt [16];
  char *symLink;
  int nVars;
  int sum;
  int k;
  int j;
  int i;
  int fHigh_local;
  Abc_TgMan_t *pMan_local;
  
  symLink._4_4_ = 0;
  nVars_00 = pMan->nVars;
  memset(&pPerm,0,0x10);
  if (pMan->fPhased == 0) {
    iVar3 = pMan->nVars;
    for (sum = 0; sum < pMan->pGroup[0].nGVars; sum = sum + 1) {
      cVar1 = pMan->pPerm[sum];
      iVar_00 = (int)cVar1;
      if (iVar_00 < 0) {
        __assert_fail("jVar >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                      ,0x792,"void Abc_TgPurgeSymmetry(Abc_TgMan_t *, int)");
      }
      iVar2 = Abc_TtHasVar(pMan->pTruth,nVars_00,iVar_00);
      if (iVar2 == 0) {
        pMan->symLink[iVar_00] = pMan->symLink[iVar3];
        pMan->symLink[iVar3] = cVar1;
        pMan->pPerm[sum] = -1;
        pPerm._0_1_ = (char)pPerm + '\x01';
      }
    }
  }
  for (nVars = 0; nVars < pMan->nGroups; nVars = nVars + 1) {
    iVar3 = Abc_TgGroupSymmetry(pMan,pMan->pGroup + nVars,fHigh);
    gcnt[(long)nVars + -8] = gcnt[(long)nVars + -8] + (char)iVar3;
  }
  k = 0;
  while( true ) {
    bVar4 = false;
    if (k < nVars_00) {
      bVar4 = -1 < pMan->pPerm[k];
    }
    sum = k;
    if (!bVar4) break;
    k = k + 1;
  }
  while( true ) {
    do {
      sum = sum + 1;
      bVar4 = false;
      if (sum < nVars_00) {
        bVar4 = pMan->pPerm[sum] < '\0';
      }
    } while (bVar4);
    if (nVars_00 <= sum) break;
    pMan->pPerm[k] = pMan->pPerm[sum];
    k = k + 1;
  }
  for (nVars = 0; nVars < pMan->nGroups; nVars = nVars + 1) {
    pMan->pGroup[nVars].nGVars = pMan->pGroup[nVars].nGVars - gcnt[(long)nVars + -8];
    pMan->pGroup[nVars].iStart = pMan->pGroup[nVars].iStart - (char)symLink._4_4_;
    symLink._4_4_ = gcnt[(long)nVars + -8] + symLink._4_4_;
  }
  if (pMan->pGroup[0].nGVars == '\0') {
    pMan->nGroups = pMan->nGroups + -1;
    memmove(pMan->pGroup,pMan->pGroup + 1,(long)pMan->nGroups << 1);
    if (pMan->pGroup[0].iStart != '\0') {
      __assert_fail("pMan->pGroup[0].iStart == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/dau/dauCanon.c"
                    ,0x7b2,"void Abc_TgPurgeSymmetry(Abc_TgMan_t *, int)");
    }
  }
  pMan->nGVars = pMan->nGVars - symLink._4_4_;
  return;
}

Assistant:

static void Abc_TgPurgeSymmetry(Abc_TgMan_t * pMan, int fHigh)
{
    int i, j, k, sum = 0, nVars = pMan->nVars;
    signed char *symLink = pMan->symLink;
    char gcnt[16] = { 0 };
    char * pPerm = pMan->pPerm;

    // purge unsupported variables
    if (!pMan->fPhased)
    {
        int iVar = pMan->nVars;
        for (j = 0; j < pMan->pGroup[0].nGVars; j++)
        {
            int jVar = pPerm[j];
            assert(jVar >= 0);
            if (!Abc_TtHasVar(pMan->pTruth, nVars, jVar))
            {
                symLink[jVar] = symLink[iVar];
                symLink[iVar] = jVar;
                pPerm[j] = -1;
                gcnt[0]++;
            }
        }
    }

    for (k = 0; k < pMan->nGroups; k++)
        gcnt[k] += Abc_TgGroupSymmetry(pMan, pMan->pGroup + k, fHigh);

    for (i = 0; i < nVars && pPerm[i] >= 0; i++)
        ;
    for (j = i + 1; ; i++, j++)
    {
        while (j < nVars && pPerm[j] < 0) j++;
        if (j >= nVars) break;
        pPerm[i] = pPerm[j];
    }
    for (k = 0; k < pMan->nGroups; k++)
    {
        pMan->pGroup[k].nGVars -= gcnt[k];
        pMan->pGroup[k].iStart -= sum;
        sum += gcnt[k];
    }
    if (pMan->pGroup[0].nGVars == 0)
    {
        pMan->nGroups--;
        memmove(pMan->pGroup, pMan->pGroup + 1, sizeof(TiedGroup) * pMan->nGroups);
        assert(pMan->pGroup[0].iStart == 0);
    }
    pMan->nGVars -= sum;
}